

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O1

char * re2::TerminateNumber(char *buf,char *str,int n)

{
  int iVar1;
  uint uVar2;
  size_t __n;
  
  if ((n < 1) || (iVar1 = isspace((int)*str), iVar1 == 0)) {
    __n = (size_t)n;
    if (9 < (int)str[__n] - 0x30U) {
      uVar2 = (byte)str[__n] - 0x41;
      if (0x25 < uVar2) {
        return str;
      }
      if ((0x3f0000003fU >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
        return str;
      }
    }
    if (n < 0x21) {
      memcpy(buf,str,__n);
      buf[__n] = '\0';
      return buf;
    }
  }
  return "";
}

Assistant:

static const char* TerminateNumber(char* buf, const char* str, int n) {
  if ((n > 0) && isspace(*str)) {
    // We are less forgiving than the strtoxxx() routines and do not
    // allow leading spaces.
    return "";
  }

  // See if the character right after the input text may potentially
  // look like a digit.
  if (isdigit(str[n]) ||
      ((str[n] >= 'a') && (str[n] <= 'f')) ||
      ((str[n] >= 'A') && (str[n] <= 'F'))) {
    if (n > kMaxNumberLength) return ""; // Input too big to be a valid number
    memcpy(buf, str, n);
    buf[n] = '\0';
    return buf;
  } else {
    // We can parse right out of the supplied string, so return it.
    return str;
  }
}